

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void update_loss_alarm(quicly_conn_t *conn,int is_after_send)

{
  uint handshake_is_in_progress_00;
  uint has_outstanding_00;
  undefined4 in_ESI;
  long in_RDI;
  quicly_loss_t *unaff_retaddr;
  uint64_t in_stack_00000010;
  int in_stack_00000018;
  int handshake_is_in_progress;
  int has_outstanding;
  quicly_conn_t *in_stack_ffffffffffffffb8;
  undefined3 in_stack_ffffffffffffffe8;
  undefined3 uVar1;
  undefined4 uVar2;
  byte bVar3;
  uint uVar4;
  int can_send_stream_data;
  
  uVar2 = CONCAT13(1,in_stack_ffffffffffffffe8);
  if (*(long *)(in_RDI + 0x648) == 0) {
    uVar2 = CONCAT13((*(byte *)(in_RDI + 0x2f8) >> 1 & 1) != 0,in_stack_ffffffffffffffe8);
  }
  bVar3 = (byte)((uint)uVar2 >> 0x18);
  handshake_is_in_progress_00 = (uint)bVar3;
  uVar1 = CONCAT12(1,(short)uVar2);
  if (*(long *)(in_RDI + 0x530) == 0) {
    uVar1 = CONCAT12(*(long *)(in_RDI + 0x538) != 0,(short)uVar2);
  }
  can_send_stream_data = CONCAT13(bVar3,uVar1);
  has_outstanding_00 = (uint)(byte)((uint3)uVar1 >> 0x10);
  uVar4 = handshake_is_in_progress_00;
  scheduler_can_send(in_stack_ffffffffffffffb8);
  quicly_loss_update_alarm
            (unaff_retaddr,in_RDI,CONCAT44(in_ESI,uVar4),has_outstanding_00,can_send_stream_data,
             handshake_is_in_progress_00,in_stack_00000010,in_stack_00000018);
  return;
}

Assistant:

static void update_loss_alarm(quicly_conn_t *conn, int is_after_send)
{
    int has_outstanding = conn->egress.loss.sentmap.bytes_in_flight != 0 || conn->super.remote.address_validation.send_probe,
        handshake_is_in_progress = conn->initial != NULL || conn->handshake != NULL;
    quicly_loss_update_alarm(&conn->egress.loss, conn->stash.now, conn->egress.last_retransmittable_sent_at, has_outstanding,
                             scheduler_can_send(conn), handshake_is_in_progress, conn->egress.max_data.sent, is_after_send);
}